

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteorder.c
# Opt level: O1

void endianness(List *code,ByteSize desired_size,ByteOrder hint,BOOL strong_hint,
               ExprInfo *field_info)

{
  Token *original;
  anon_union_8_7_0ba269be_for_u aVar1;
  unsigned_long uVar2;
  Token *pTVar3;
  TokenType TVar4;
  undefined4 uVar5;
  ByteSize BVar6;
  ByteSize BVar7;
  ulong uVar8;
  char *pcVar9;
  List *pLVar10;
  List *pLVar11;
  BOOL BVar12;
  undefined4 extraout_var;
  ListStruct *pLVar13;
  ListStruct *expr;
  ByteOrder hint_00;
  ulong uVar14;
  ExprInfo EVar15;
  ExprInfo EVar16;
  char buf [256];
  char local_138 [264];
  
  EVar15 = expr_info(code,hint,field_info);
  if (code == (List *)0x0) {
    return;
  }
  original = &code->token;
  if ((strong_hint != FALSE) && (original->type == TOK_DOLLAR_NUMBER)) {
    field_info[(code->token).u.reginfo.which].order = hint;
    return;
  }
  if (original->type != TOK_LIST) goto LAB_0010ebf3;
  pLVar10 = code->car;
  hint_00 = EVar15.order;
  BVar6 = desired_size;
  BVar12 = strong_hint;
  switch((pLVar10->token).type) {
  case TOK_IF:
    for (pLVar13 = pLVar10->cdr; pLVar13 != (List *)0x0; pLVar13 = pLVar13->cdr) {
      endianness(pLVar13,BS_UNKNOWN,BO_NATIVE,FALSE,field_info);
    }
    break;
  case TOK_SWITCH:
    endianness(pLVar10->cdr,BS_WORD,BO_NATIVE,TRUE,field_info);
    for (pLVar13 = code->car->cdr->cdr; pLVar13 != (ListStruct *)0x0; pLVar13 = pLVar13->cdr) {
      endianness(pLVar13->car,BS_WORD,BO_NATIVE,TRUE,field_info);
      endianness(pLVar13->car->cdr,BS_UNKNOWN,BO_NATIVE,FALSE,field_info);
    }
    break;
  default:
    pcVar9 = unparse_token(&pLVar10->token,local_138);
    parse_error(pLVar10,"Unhandled operator %s in endianness().\n",pcVar9);
    break;
  case TOK_AND:
  case TOK_OR:
  case TOK_XOR:
  case TOK_NOT:
    for (pLVar13 = pLVar10->cdr; pLVar13 != (List *)0x0; pLVar13 = pLVar13->cdr) {
      endianness(pLVar13,BS_UNKNOWN,BO_NATIVE,FALSE,field_info);
    }
    break;
  case TOK_EQUAL:
  case TOK_NOT_EQUAL:
    EVar15 = expr_info(pLVar10->cdr,BO_NATIVE,field_info);
    pLVar13 = code->car->cdr;
    if (pLVar13 == (ListStruct *)0x0) {
      BVar6 = BS_UNKNOWN;
    }
    else {
      BVar6 = BS_UNKNOWN;
      expr = pLVar13;
      do {
        EVar16 = expr_info(expr,BO_NATIVE,field_info);
        BVar7 = EVar16.size;
        if (EVar16.size < BVar6) {
          BVar7 = BVar6;
        }
        BVar6 = BVar7;
        expr = expr->cdr;
      } while (expr != (ListStruct *)0x0);
    }
    hint_00 = EVar15.order;
    goto LAB_0010ebe6;
  case TOK_GREATER_THAN:
  case TOK_LESS_THAN:
  case TOK_GREATER_OR_EQUAL:
  case TOK_LESS_OR_EQUAL:
    for (pLVar13 = pLVar10->cdr; pLVar13 != (List *)0x0; pLVar13 = pLVar13->cdr) {
      pLVar10 = code->car->cdr;
      if (pLVar10 == (List *)0x0) {
        BVar6 = BS_UNKNOWN;
      }
      else {
        uVar14 = 0;
        do {
          EVar15 = expr_info(pLVar10,BO_NATIVE,field_info);
          uVar8 = EVar15._0_8_ >> 0x20;
          if (EVar15.size < (ByteSize)uVar14) {
            uVar8 = uVar14;
          }
          pLVar10 = pLVar10->cdr;
          BVar6 = (ByteSize)uVar8;
          uVar14 = uVar8;
        } while (pLVar10 != (ListStruct *)0x0);
      }
      endianness(pLVar13,BVar6,BO_NATIVE,TRUE,field_info);
    }
    break;
  case TOK_SHIFT_LEFT:
  case TOK_SHIFT_RIGHT:
  case TOK_PLUS:
  case TOK_MINUS:
  case TOK_MULTIPLY:
  case TOK_DIVIDE:
  case TOK_MOD:
  case TOK_BITWISE_AND:
  case TOK_BITWISE_OR:
  case TOK_BITWISE_XOR:
  case TOK_BITWISE_NOT:
    pLVar13 = pLVar10->cdr;
    if (pLVar13 != (ListStruct *)0x0) {
      uVar14 = EVar15._0_8_ >> 0x20;
      if (uVar14 == 0) {
        uVar14 = (ulong)desired_size;
      }
      do {
        endianness(pLVar13,(ByteSize)uVar14,hint_00,TRUE,field_info);
        pLVar13 = pLVar13->cdr;
      } while (pLVar13 != (ListStruct *)0x0);
    }
    break;
  case TOK_ASSIGN:
    pLVar10 = pLVar10->cdr;
    if (4 < (pLVar10->token).type - TOK_CCC) {
      if (EVar15._0_8_ >> 0x20 == 0) {
        parse_error(pLVar10,"Attempting to assign to object of unknown size!\n",
                    CONCAT44(extraout_var,EVar15.sgnd));
        print_list((FILE *)_stderr,code);
        putc(10,_stderr);
      }
      BVar6 = EVar15.size;
      endianness(code->car->cdr,BVar6,hint,FALSE,field_info);
      pLVar13 = code->car->cdr->cdr;
      goto LAB_0010ebe6;
    }
    pLVar10 = pLVar10->cdr;
    hint_00 = hint;
    goto LAB_0010ebeb;
  case TOK_FUNC_CALL:
    for (pLVar13 = pLVar10->cdr->cdr; pLVar13 != (List *)0x0; pLVar13 = pLVar13->cdr) {
      endianness(pLVar13,BS_UNKNOWN,BO_NATIVE,TRUE,field_info);
    }
    break;
  case TOK_CAST:
    for (pLVar13 = pLVar10->cdr->cdr; pLVar13 != (List *)0x0; pLVar13 = pLVar13->cdr) {
      endianness(pLVar13,BS_UNKNOWN,BO_NATIVE,TRUE,field_info);
    }
    break;
  case TOK_DEREF:
    pLVar13 = pLVar10->cdr;
    if ((pLVar10->token).u.reginfo.size == '\0') {
      pLVar13 = pLVar13->cdr;
    }
    BVar6 = BS_LONG;
    hint_00 = BO_NATIVE;
LAB_0010ebe6:
    pLVar10 = pLVar13;
    BVar12 = TRUE;
    goto LAB_0010ebeb;
  case TOK_SWAP:
    pTVar3 = &pLVar10->token;
    pLVar10 = pLVar10->cdr;
    BVar6 = (uint)(pTVar3->u).reginfo.size;
    hint_00 = hint == BO_NATIVE | BO_NATIVE;
    goto LAB_0010ebeb;
  case TOK_EXPLICIT_LIST:
    for (pLVar13 = pLVar10->cdr; pLVar13 != (List *)0x0; pLVar13 = pLVar13->cdr) {
      endianness(pLVar13,desired_size,hint,strong_hint,field_info);
    }
    break;
  case TOK_LIST:
    hint_00 = hint;
LAB_0010ebeb:
    endianness(pLVar10,BVar6,hint_00,BVar12,field_info);
  }
LAB_0010ebf3:
  EVar15 = expr_info(code,hint,field_info);
  if (EVar15.order != hint && strong_hint != FALSE) {
    BVar7 = EVar15.size;
    BVar6 = BVar7;
    if (((desired_size != BS_UNKNOWN) && (BVar6 = desired_size, EVar15._0_8_ >> 0x20 != 0)) &&
       (BVar7 < desired_size)) {
      BVar6 = BVar7;
    }
    if (BVar6 != BS_BYTE) {
      if (BVar6 == BS_UNKNOWN) {
        parse_error(code,
                    "Internal error, byteorder.c: Attempting to swap with size == BS_UNKNOWN!\n");
      }
      else {
        pLVar10 = alloc_list();
        pLVar11 = alloc_list();
        pLVar13 = code->car;
        TVar4 = (code->token).type;
        uVar5 = *(undefined4 *)&(code->token).field_0x4;
        aVar1 = (code->token).u;
        pcVar9 = (code->token).filename;
        uVar2 = (code->token).lineno;
        pLVar11->cdr = code->cdr;
        pLVar11->car = pLVar13;
        (pLVar11->token).type = TVar4;
        *(undefined4 *)&(pLVar11->token).field_0x4 = uVar5;
        (pLVar11->token).u = aVar1;
        (pLVar11->token).filename = pcVar9;
        (pLVar11->token).lineno = uVar2;
        pLVar11->cdr = (ListStruct *)0x0;
        (pLVar10->token).type = TOK_SWAP;
        if ((BVar6 != BS_WORD) && (BVar6 != BS_LONG)) {
          __assert_fail("size == 1 || size == 2 || size == 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/autc04[P]syn68k/syngen/byteorder.c"
                        ,0x137,"void swap(List *, ByteSize, BOOL)");
        }
        (pLVar10->token).u.reginfo.size = (uchar)BVar6;
        (pLVar10->token).u.reginfo.sgnd = (uchar)EVar15.sgnd;
        pLVar10->cdr = pLVar11;
        (code->token).type = TOK_LIST;
        code->car = pLVar10;
        propagate_fileinfo(original,code);
      }
    }
  }
  return;
}

Assistant:

static void
endianness (List *code, ByteSize desired_size, ByteOrder hint,
	    BOOL strong_hint, ExprInfo *field_info)
{
  ExprInfo info = expr_info (code, hint, field_info);
  Token *t = &code->token;
  char buf[256];

  if (code == NULL)
    return;

#if 0
  printf ("Endianness: desired_size = %d, hint = %d, strong_hint = %d\n",
	  desired_size, hint, strong_hint);
  print_list (stdout, code);
  putchar ('\n');
#endif

  if (strong_hint && t->type == TOK_DOLLAR_NUMBER)
    {
      field_info[t->u.dollarinfo.which].order = hint;
      return;
    }
    
  if (t->type == TOK_LIST)
    {
      List *l2;
      
      t = &code->car->token;
      switch (t->type) {
      case TOK_SHIFT_RIGHT:
      case TOK_SHIFT_LEFT:
      case TOK_PLUS:
      case TOK_MINUS:
      case TOK_MULTIPLY:
      case TOK_DIVIDE:
      case TOK_MOD:
      case TOK_BITWISE_AND:
      case TOK_BITWISE_OR:
      case TOK_BITWISE_XOR:
      case TOK_BITWISE_NOT:
	/* Force all operands to be the same endianness... */
	for (l2 = CDAR (code); l2 != NULL; l2 = l2->cdr)
	  {
	    endianness (l2, ((info.size == BS_UNKNOWN)
			     ? desired_size : info.size),
			info.order, TRUE, field_info);
	  }
	break;

      case TOK_EXPLICIT_LIST:
	for (l2 = CDAR (code); l2 != NULL; l2 = l2->cdr)
	  {
	    /* Just process everything else. */
	    endianness (l2, desired_size, hint, strong_hint, field_info);
	  }
	break;

      case TOK_LIST:
	endianness (code->car, desired_size, hint, strong_hint, field_info);
	break;

      case TOK_ASSIGN:
	if (IS_CCBIT_TOKEN (CDAR (code)->token.type))
	  {
#ifdef CCR_ELEMENT_8_BITS
	    endianness (CDDAR (code), BS_UNKNOWN, BO_NATIVE, TRUE,
			field_info);
#else   /* !CCR_ELEMENT_8_BITS */
	    endianness (CDDAR (code), desired_size, hint, strong_hint,
			field_info);
#endif  /* !CCR_ELEMENT_8_BITS */
	  }
	else
	  {
	    if (info.size == BS_UNKNOWN)
	      {
		parse_error (CDAR (code), "Attempting to assign to object "
			     "of unknown size!\n");
		print_list (stderr, code);
		putc ('\n', stderr);
	      }

	    /* Process LHS. */
	    endianness (CDAR (code), info.size, hint, FALSE, field_info);
	    
	    /* Force RHS to have same type as LHS. */
	    endianness (CDDAR (code), info.size, info.order, TRUE, field_info);
	  }
	break;

      case TOK_SWAP:
	/* Process operand. */
	endianness (CDAR (code), t->u.swapinfo.size,
		    (hint == BO_NATIVE) ? BO_BIG_ENDIAN : BO_NATIVE,
		    strong_hint, field_info);
	break;

      case TOK_DEREF:
	/* Force address to be native. */
	if (t->u.derefinfo.size != 0)
	  endianness (CDAR (code), BS_LONG, BO_NATIVE, TRUE, field_info);
	else
	  endianness (CDDAR (code), BS_LONG, BO_NATIVE, TRUE, field_info);
	break;

      case TOK_EQUAL:
      case TOK_NOT_EQUAL:
	{
	  /* Force both operands to be the same endianness (don't
	   * care which since we are testing equality).
	   */
	  ExprInfo info2 = expr_info (CDAR (code), BO_NATIVE, field_info);
	  endianness (CDAR (code), expr_list_max_size (CDAR (code),
						       BO_NATIVE,
						       field_info),
		      info2.order, TRUE, field_info);
	}
	break;

      case TOK_GREATER_THAN:
      case TOK_GREATER_OR_EQUAL:
      case TOK_LESS_THAN:
      case TOK_LESS_OR_EQUAL:
	/* Force all operands to be BO_NATIVE. */
	for (l2 = CDAR (code); l2 != NULL; l2 = l2->cdr)
	  {
	    endianness (l2, expr_list_max_size (CDAR (code), BO_NATIVE,
						field_info),
			BO_NATIVE, TRUE, field_info);
	  }
	break;

      case TOK_AND:
      case TOK_OR:
      case TOK_XOR:
      case TOK_NOT:
	/* Process all of the boolean things.  Don't care about endianness. */
	for (l2 = CDAR (code); l2 != NULL; l2 = l2->cdr)
	  {
	    endianness (l2, BS_UNKNOWN, BO_NATIVE, FALSE, field_info);
	  }
	break;

      case TOK_IF:
	for (l2 = CDAR (code); l2 != NULL; l2 = l2->cdr)
	  {
	    /* Just process everything. */
	    endianness (l2, BS_UNKNOWN, BO_NATIVE, FALSE, field_info);
	  }
	break;

      case TOK_SWITCH:
	/* Force switch value to be native. */
	endianness (CDAR (code), BS_WORD, BO_NATIVE, TRUE, field_info);
	for (l2 = CDDAR (code); l2 != NULL; l2 = l2->cdr)
	  {
	    /* Force case value to be native. */
	    endianness (l2->car, BS_WORD, BO_NATIVE, TRUE, field_info);
	    
	    /* Process case code. */
	    endianness (CDAR (l2), BS_UNKNOWN, BO_NATIVE, FALSE, field_info);
	  }
	break;

      case TOK_FUNC_CALL:
	for (l2 = CDDAR (code); l2 != NULL; l2 = l2->cdr)
	  {
	    /* Force everything to be native */
	    endianness (l2, BS_UNKNOWN, BO_NATIVE, TRUE, field_info);
	  }
	break;

      case TOK_CAST:
	for (l2 = CDDAR (code); l2 != NULL; l2 = l2->cdr)
	  {
	    /* Just process everything. */
	    endianness (l2, BS_UNKNOWN, BO_NATIVE, TRUE, field_info);
	  }
	break;

      default:
	parse_error (code->car, "Unhandled operator %s in endianness().\n",
		     unparse_token (t, buf));
	break;
      }
    }

  /* If we are backwards and this upsets someone, swap! */
  info = expr_info (code, hint, field_info);
  if (strong_hint && info.order != hint)
    {
      ByteSize s;

      if (desired_size == BS_UNKNOWN)
	s = info.size;
      else if (info.size == BS_UNKNOWN)
	s = desired_size;
      else
	s = MIN (desired_size, info.size);

      swap (code, s, info.sgnd);
    }
}